

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::WordBoundaryNode::AnnotatePass1
          (WordBoundaryNode *this,Compiler *compiler,bool parentNotInLoop,bool parentAtLeastOnce,
          bool parentNotSpeculative,bool parentNotNegated)

{
  CharSet<char16_t> *pCVar1;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  StandardChars<char16_t> *this_00;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  
  (this->super_Node).features = 8;
  (this->super_Node).thisConsumes.lower = 0;
  (this->super_Node).thisConsumes.upper = 0;
  *(uint *)&(this->super_Node).field_0xc =
       (*(uint *)&(this->super_Node).field_0xc & 0xffffc3cc) +
       ((int)CONCAT71(in_register_00000011,parentNotInLoop) << 10 |
        (int)CONCAT71(in_register_00000009,parentAtLeastOnce) << 0xb |
        (int)CONCAT71(in_register_00000081,parentNotSpeculative) << 0xc |
       (int)CONCAT71(in_register_00000089,parentNotNegated) << 0xd) + 0x30;
  if (this->isNegation == true) {
    this_00 = compiler->standardChars;
  }
  else {
    if ((this->mustIncludeEntering == true) && (this->mustIncludeLeaving == false)) {
      pCVar1 = StandardChars<char16_t>::GetWordSet(compiler->standardChars);
      goto LAB_00eab265;
    }
    this_00 = compiler->standardChars;
    if ((this->mustIncludeEntering == false) && (this->mustIncludeLeaving != false)) {
      pCVar1 = StandardChars<char16_t>::GetNonWordSet(this_00);
      goto LAB_00eab265;
    }
  }
  pCVar1 = StandardChars<char16_t>::GetFullSet(this_00);
LAB_00eab265:
  (this->super_Node).firstSet = pCVar1;
  return;
}

Assistant:

void WordBoundaryNode::AnnotatePass1(Compiler& compiler, bool parentNotInLoop, bool parentAtLeastOnce, bool parentNotSpeculative, bool parentNotNegated)
    {
        features = HasWordBoundary;
        thisConsumes.Exact(0);
        isFirstExact = false;
        isThisIrrefutable = false;
        isThisWillNotProgress = true;
        isThisWillNotRegress = true;
        isNotInLoop = parentNotInLoop;
        isAtLeastOnce = parentAtLeastOnce;
        isNotSpeculative = parentNotSpeculative;
        isNotNegated = parentNotNegated;
        if (isNegation)
            firstSet = compiler.standardChars->GetFullSet();
        else
        {
            if (mustIncludeEntering && !mustIncludeLeaving)
                firstSet = compiler.standardChars->GetWordSet();
            else if (mustIncludeLeaving && !mustIncludeEntering)
                firstSet = compiler.standardChars->GetNonWordSet();
            else
                firstSet = compiler.standardChars->GetFullSet();
        }
    }